

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

color * __thiscall
camera::ray_color(color *__return_storage_ptr__,camera *this,ray *r,int depth,hittable *world,
                 hittable *lights)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar4;
  color sample_color;
  color color_from_emission;
  mixture_pdf p;
  scatter_record srec;
  ray scattered;
  hit_record rec;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  vec3 local_1d0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  hittable *local_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  double local_188;
  double dStack_180;
  double local_178;
  mixture_pdf local_170;
  double local_148;
  double dStack_140;
  double local_138;
  element_type *peStack_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  char local_120;
  ray local_118;
  ray local_d8;
  _func_int **local_98;
  double dStack_90;
  _func_int **local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined4 local_50;
  undefined4 local_48;
  
  if (depth < 1) {
    __return_storage_ptr__->e[0] = 0.0;
    __return_storage_ptr__->e[1] = 0.0;
    __return_storage_ptr__->e[2] = 0.0;
  }
  else {
    local_68 = (long *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = (_func_int **)0x0;
    uStack_80 = 0;
    local_98 = (_func_int **)0x0;
    dStack_90 = 0.0;
    iVar2 = (*world->_vptr_hittable[2])(0xd2f1a9fc,0,world,r);
    if ((char)iVar2 == '\0') {
      __return_storage_ptr__->e[2] = (this->background).e[2];
      dVar4 = (this->background).e[1];
      __return_storage_ptr__->e[0] = (this->background).e[0];
      __return_storage_ptr__->e[1] = dVar4;
    }
    else {
      local_118.dir.e[1] = 0.0;
      local_118.dir.e[2] = 0.0;
      local_118.orig.e[2] = 0.0;
      local_118.dir.e[0] = 0.0;
      local_118.orig.e[0] = 0.0;
      local_118.orig.e[1] = 0.0;
      local_148 = 0.0;
      dStack_140 = 0.0;
      local_138 = 0.0;
      peStack_130 = (element_type *)0x0;
      local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (**(code **)(*local_68 + 0x10))(local_50,local_48,&local_188,local_68,r,&local_98,&local_98);
      cVar1 = (**(code **)(*local_68 + 0x18))(local_68,r,&local_98,&local_148);
      if (cVar1 == '\0') {
        __return_storage_ptr__->e[2] = local_178;
        __return_storage_ptr__->e[0] = local_188;
        __return_storage_ptr__->e[1] = dStack_180;
      }
      else if (local_120 == '\x01') {
        ray_color(&local_d8.orig,this,&local_118,depth + -1,world,lights);
        __return_storage_ptr__->e[0] = local_148 * local_d8.orig.e[0];
        __return_storage_ptr__->e[1] = dStack_140 * local_d8.orig.e[1];
        __return_storage_ptr__->e[2] = local_138 * local_d8.orig.e[2];
      }
      else {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        this_01->_M_use_count = 1;
        this_01->_M_weak_count = 1;
        this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011f7a8;
        local_170.p[0].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(this_01 + 1);
        this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__pdf_0011f7f8;
        *(hittable **)&this_01[1]._M_use_count = lights;
        this_01[3]._vptr__Sp_counted_base = local_88;
        this_01[2]._vptr__Sp_counted_base = local_98;
        *(double *)&this_01[2]._M_use_count = dStack_90;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = 2;
        }
        local_198 = peStack_130;
        local_190._M_pi = local_128;
        if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_128->_M_use_count = local_128->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_128->_M_use_count = local_128->_M_use_count + 1;
          }
        }
        local_170.super_pdf._vptr_pdf = (_func_int **)&PTR__mixture_pdf_0011f850;
        local_170.p[0].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8._M_pi = this_01;
        local_1a0 = lights;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_170.p[0].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_1d8);
        local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_198;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_190);
        if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
        }
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
        mixture_pdf::generate(&local_1d0,&local_170);
        local_d8.tm = r->tm;
        local_d8.orig.e[2] = (double)local_88;
        local_d8.orig.e[0] = (double)local_98;
        local_d8.orig.e[1] = dStack_90;
        local_d8.dir.e[0]._0_4_ = local_1d0.e[0]._0_4_;
        local_d8.dir.e[0]._4_4_ = local_1d0.e[0]._4_4_;
        local_d8.dir.e[1]._0_4_ = local_1d0.e[1]._0_4_;
        local_d8.dir.e[1]._4_4_ = local_1d0.e[1]._4_4_;
        local_d8.dir.e[2] = local_1d0.e[2];
        (*(local_170.p[0].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_pdf[2])
                  (local_170.p[0].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_d8.dir);
        local_1a8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        (*(local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_pdf[2])
                  (local_170.p[1].super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_d8.dir);
        local_1b0 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_1b8 = (double)(**(code **)(*local_68 + 0x20))(local_68,r,&local_98,&local_d8);
        ray_color(&local_1d0,this,&local_d8,depth + -1,world,local_1a0);
        dVar4 = 1.0 / (local_1a8 * 0.5 + local_1b0 * 0.5);
        __return_storage_ptr__->e[0] =
             local_148 * local_1b8 * (double)CONCAT44(local_1d0.e[0]._4_4_,local_1d0.e[0]._0_4_) *
             dVar4 + local_188;
        __return_storage_ptr__->e[1] =
             dStack_140 * local_1b8 * (double)CONCAT44(local_1d0.e[1]._4_4_,local_1d0.e[1]._0_4_) *
             dVar4 + dStack_180;
        __return_storage_ptr__->e[2] = dVar4 * local_1b8 * local_138 * local_1d0.e[2] + local_178;
        local_170.super_pdf._vptr_pdf = (_func_int **)&PTR__mixture_pdf_0011f850;
        lVar3 = 0x20;
        do {
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)local_170.p + lVar3 + -8);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          lVar3 = lVar3 + -0x10;
        } while (lVar3 != 0);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

color ray_color(const ray& r, int depth, const hittable& world, const hittable& lights)
    const {
        // If we've exceeded the ray bounce limit, no more light is gathered.
        if (depth <= 0)
            return color(0,0,0);

        hit_record rec;

        // If the ray hits nothing, return the background color.
        if (!world.hit(r, interval(0.001, infinity), rec))
            return background;

        scatter_record srec;
        color color_from_emission = rec.mat->emitted(r, rec, rec.u, rec.v, rec.p);

        if (!rec.mat->scatter(r, rec, srec))
            return color_from_emission;

        if (srec.skip_pdf) {
            return srec.attenuation * ray_color(srec.skip_pdf_ray, depth-1, world, lights);
        }

        auto light_ptr = make_shared<hittable_pdf>(lights, rec.p);
        mixture_pdf p(light_ptr, srec.pdf_ptr);

        ray scattered = ray(rec.p, p.generate(), r.time());
        auto pdf_value = p.value(scattered.direction());

        double scattering_pdf = rec.mat->scattering_pdf(r, rec, scattered);

        color sample_color = ray_color(scattered, depth-1, world, lights);
        color color_from_scatter =
            (srec.attenuation * scattering_pdf * sample_color) / pdf_value;

        return color_from_emission + color_from_scatter;
    }